

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O3

wchar_t do_shape(bidi_char *line,bidi_char *to,wchar_t count)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  undefined *puVar7;
  wchar_t wVar8;
  uint uVar9;
  bool bVar10;
  
  if (L'\0' < count) {
    uVar2 = (ulong)(uint)count;
    puVar4 = &line[-1].wc;
    uVar3 = 1;
    do {
      iVar1 = puVar4[4];
      to->index = (short)iVar1;
      to->nchars = (short)((uint)iVar1 >> 0x10);
      iVar1 = (puVar4 + 2)[1];
      to->origwc = (puVar4 + 2)[0];
      to->wc = iVar1;
      uVar9 = puVar4[3] - 0x621;
      if (uVar9 < 0xb2) {
        if (shapetypes[uVar9].type == '\x02') {
          uVar5 = 3;
          if ((uVar3 < uVar2) && (puVar4[6] - 0x621 < 0xb2)) {
            uVar5 = (uint)shapetypes[puVar4[6] - 0x621].type;
          }
          if (uVar3 == 1 || puVar4[3] != 0x644) {
switchD_00101464_caseD_624:
            if ((uVar5 < 5) && ((0x15U >> (uVar5 & 0x1f) & 1) != 0)) {
              if (((uVar3 == 1) || (0xb1 < *puVar4 - 0x621)) ||
                 ((4 < (byte)shapetypes[*puVar4 - 0x621].type ||
                  ((0x16U >> ((byte)shapetypes[*puVar4 - 0x621].type & 0x1f) & 1) == 0))))
              goto LAB_00101447;
              wVar8 = shapetypes[uVar9].form_b + L'\x03';
            }
            else {
              if ((uVar3 == 1) ||
                 (((0xb1 < *puVar4 - 0x621 || (4 < (byte)shapetypes[*puVar4 - 0x621].type)) ||
                  ((0x16U >> ((byte)shapetypes[*puVar4 - 0x621].type & 0x1f) & 1) == 0))))
              goto LAB_001014a7;
              wVar8 = shapetypes[uVar9].form_b + L'\x02';
            }
            goto LAB_001014ac;
          }
          switch(*puVar4) {
          case 0x622:
            uVar9 = 0xfef5;
            puVar7 = &DAT_00108900;
            break;
          case 0x623:
            uVar9 = 0xfef7;
            puVar7 = &DAT_00108914;
            break;
          default:
            goto switchD_00101464_caseD_624;
          case 0x625:
            uVar9 = 0xfef9;
            puVar7 = &DAT_00108928;
            break;
          case 0x627:
            uVar9 = 0xfefb;
            puVar7 = &DAT_0010893c;
          }
          if (uVar5 < 5) {
            uVar9 = *(uint *)(puVar7 + (long)(int)uVar5 * 4);
          }
          to->wc = uVar9;
          wVar8 = L' ';
          lVar6 = -8;
        }
        else {
          if (shapetypes[uVar9].type != '\x01') goto LAB_001014b6;
          if (((uVar3 < uVar2) && (puVar4[6] - 0x621 < 0xb2)) &&
             (((byte)shapetypes[puVar4[6] - 0x621].type < 5 &&
              ((0x15U >> ((byte)shapetypes[puVar4[6] - 0x621].type & 0x1f) & 1) != 0)))) {
LAB_00101447:
            wVar8 = shapetypes[uVar9].form_b + L'\x01';
          }
          else {
LAB_001014a7:
            wVar8 = shapetypes[uVar9].form_b;
          }
LAB_001014ac:
          lVar6 = 4;
        }
        *(wchar_t *)((long)&to->origwc + lVar6) = wVar8;
      }
LAB_001014b6:
      puVar4 = puVar4 + 3;
      to = to + 1;
      bVar10 = uVar3 != uVar2;
      uVar3 = uVar3 + 1;
    } while (bVar10);
  }
  return L'\x01';
}

Assistant:

int do_shape(bidi_char *line, bidi_char *to, int count)
{
    int i, tempShape;
    bool ligFlag = false;

    for (i=0; i<count; i++) {
        to[i] = line[i];
        tempShape = STYPE(line[i].wc);
        switch (tempShape) {
          case SC:
            break;

          case SU:
            break;

          case SR:
            tempShape = (i+1 < count ? STYPE(line[i+1].wc) : SU);
            if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                to[i].wc = SFINAL((SISOLATED(line[i].wc)));
            else
                to[i].wc = SISOLATED(line[i].wc);
            break;


          case SD:
            /* Make Ligatures */
            tempShape = (i+1 < count ? STYPE(line[i+1].wc) : SU);
            if (line[i].wc == 0x644) {
                if (i > 0) switch (line[i-1].wc) {
                  case 0x622:
                    ligFlag = true;
                    if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                        to[i].wc = 0xFEF6;
                    else
                        to[i].wc = 0xFEF5;
                    break;
                  case 0x623:
                    ligFlag = true;
                    if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                        to[i].wc = 0xFEF8;
                    else
                        to[i].wc = 0xFEF7;
                    break;
                  case 0x625:
                    ligFlag = true;
                    if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                        to[i].wc = 0xFEFA;
                    else
                        to[i].wc = 0xFEF9;
                    break;
                  case 0x627:
                    ligFlag = true;
                    if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC))
                        to[i].wc = 0xFEFC;
                    else
                        to[i].wc = 0xFEFB;
                    break;
                }
                if (ligFlag) {
                    to[i-1].wc = 0x20;
                    ligFlag = false;
                    break;
                }
            }

            if ((tempShape == SL) || (tempShape == SD) || (tempShape == SC)) {
                tempShape = (i > 0 ? STYPE(line[i-1].wc) : SU);
                if ((tempShape == SR) || (tempShape == SD) || (tempShape == SC))
                    to[i].wc = SMEDIAL((SISOLATED(line[i].wc)));
                else
                    to[i].wc = SFINAL((SISOLATED(line[i].wc)));
                break;
            }

            tempShape = (i > 0 ? STYPE(line[i-1].wc) : SU);
            if ((tempShape == SR) || (tempShape == SD) || (tempShape == SC))
                to[i].wc = SINITIAL((SISOLATED(line[i].wc)));
            else
                to[i].wc = SISOLATED(line[i].wc);
            break;


        }
    }
    return 1;
}